

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void * __thiscall
google::protobuf::internal::ExtensionSet::MutableRawRepeatedField
          (ExtensionSet *this,int number,FieldType field_type,bool packed,FieldDescriptor *desc)

{
  bool bVar1;
  CppType CVar2;
  RepeatedField<long> *pRVar3;
  RepeatedField<unsigned_int> *pRVar4;
  RepeatedField<unsigned_long> *pRVar5;
  RepeatedField<double> *pRVar6;
  RepeatedField<float> *pRVar7;
  RepeatedField<bool> *pRVar8;
  RepeatedField<int> *pRVar9;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar10;
  RepeatedPtrField<google::protobuf::MessageLite> *pRVar11;
  Extension *local_118;
  Extension *extension;
  FieldDescriptor *desc_local;
  bool packed_local;
  FieldType field_type_local;
  ExtensionSet *pEStack_100;
  int number_local;
  ExtensionSet *this_local;
  Arena *local_f0;
  Arena *local_e8;
  Arena *local_e0;
  Arena *local_d8;
  Arena *local_d0;
  Arena *local_c8;
  Arena *local_c0;
  Arena *local_b8;
  Arena *local_b0;
  Arena *local_a8;
  ExtensionSet *local_a0;
  ExtensionSet *local_98;
  Arena *local_90;
  Arena *local_88;
  Arena *local_80;
  Arena *local_78;
  Arena *local_70;
  Arena *local_68;
  Arena *local_60;
  Arena *local_58;
  Arena *local_50;
  Arena *local_48;
  Arena *local_40;
  Arena *local_38;
  Arena *local_30;
  Arena *local_28;
  Arena *local_20;
  Arena *local_18;
  Arena *local_10;
  
  extension = (Extension *)desc;
  desc_local._2_1_ = packed;
  desc_local._3_1_ = field_type;
  desc_local._4_4_ = number;
  pEStack_100 = this;
  bVar1 = MaybeNewExtension(this,number,desc,&local_118);
  if (bVar1) {
    local_118->is_repeated = true;
    local_118->type = desc_local._3_1_;
    local_118->is_packed = (bool)(desc_local._2_1_ & 1);
    CVar2 = WireFormatLite::FieldTypeToCppType((uint)desc_local._3_1_);
    switch(CVar2) {
    case CPPTYPE_INT32:
      local_f0 = this->arena_;
      local_a8 = local_f0;
      local_90 = local_f0;
      pRVar9 = Arena::CreateMessageInternal<google::protobuf::RepeatedField<int>>(local_f0);
      (local_118->field_0).repeated_int32_t_value = pRVar9;
      break;
    case CPPTYPE_INT64:
      local_e8 = this->arena_;
      local_88 = local_e8;
      local_80 = local_e8;
      pRVar3 = Arena::CreateMessageInternal<google::protobuf::RepeatedField<long>>(local_e8);
      (local_118->field_0).repeated_int64_t_value = pRVar3;
      break;
    case CPPTYPE_UINT32:
      local_e0 = this->arena_;
      local_78 = local_e0;
      local_70 = local_e0;
      pRVar4 = Arena::CreateMessageInternal<google::protobuf::RepeatedField<unsigned_int>>(local_e0)
      ;
      (local_118->field_0).repeated_uint32_t_value = pRVar4;
      break;
    case CPPTYPE_UINT64:
      local_d8 = this->arena_;
      local_68 = local_d8;
      local_60 = local_d8;
      pRVar5 = Arena::CreateMessageInternal<google::protobuf::RepeatedField<unsigned_long>>
                         (local_d8);
      (local_118->field_0).repeated_uint64_t_value = pRVar5;
      break;
    case CPPTYPE_DOUBLE:
      local_c8 = this->arena_;
      local_48 = local_c8;
      local_40 = local_c8;
      pRVar6 = Arena::CreateMessageInternal<google::protobuf::RepeatedField<double>>(local_c8);
      (local_118->field_0).repeated_double_value = pRVar6;
      break;
    case CPPTYPE_FLOAT:
      local_d0 = this->arena_;
      local_58 = local_d0;
      local_50 = local_d0;
      pRVar7 = Arena::CreateMessageInternal<google::protobuf::RepeatedField<float>>(local_d0);
      (local_118->field_0).repeated_float_value = pRVar7;
      break;
    case CPPTYPE_BOOL:
      local_c0 = this->arena_;
      local_38 = local_c0;
      local_30 = local_c0;
      pRVar8 = Arena::CreateMessageInternal<google::protobuf::RepeatedField<bool>>(local_c0);
      (local_118->field_0).repeated_bool_value = pRVar8;
      break;
    case CPPTYPE_ENUM:
      this_local = (ExtensionSet *)this->arena_;
      local_a0 = this_local;
      local_98 = this_local;
      pRVar9 = Arena::CreateMessageInternal<google::protobuf::RepeatedField<int>>
                         ((Arena *)this_local);
      (local_118->field_0).repeated_int32_t_value = pRVar9;
      break;
    case CPPTYPE_STRING:
      local_b8 = this->arena_;
      local_28 = local_b8;
      local_20 = local_b8;
      pRVar10 = Arena::
                CreateMessageInternal<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                          (local_b8);
      (local_118->field_0).repeated_string_value = pRVar10;
      break;
    case CPPTYPE_MESSAGE:
      local_b0 = this->arena_;
      local_18 = local_b0;
      local_10 = local_b0;
      pRVar11 = Arena::
                CreateMessageInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                          (local_b0);
      (local_118->field_0).repeated_message_value = pRVar11;
    }
  }
  return (void *)(local_118->field_0).int64_t_value;
}

Assistant:

void* ExtensionSet::MutableRawRepeatedField(int number, FieldType field_type,
                                            bool packed,
                                            const FieldDescriptor* desc) {
  Extension* extension;

  // We instantiate an empty Repeated{,Ptr}Field if one doesn't exist for this
  // extension.
  if (MaybeNewExtension(number, desc, &extension)) {
    extension->is_repeated = true;
    extension->type = field_type;
    extension->is_packed = packed;

    switch (WireFormatLite::FieldTypeToCppType(
        static_cast<WireFormatLite::FieldType>(field_type))) {
      case WireFormatLite::CPPTYPE_INT32:
        extension->repeated_int32_t_value =
            Arena::CreateMessage<RepeatedField<int32_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_INT64:
        extension->repeated_int64_t_value =
            Arena::CreateMessage<RepeatedField<int64_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT32:
        extension->repeated_uint32_t_value =
            Arena::CreateMessage<RepeatedField<uint32_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT64:
        extension->repeated_uint64_t_value =
            Arena::CreateMessage<RepeatedField<uint64_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_DOUBLE:
        extension->repeated_double_value =
            Arena::CreateMessage<RepeatedField<double>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_FLOAT:
        extension->repeated_float_value =
            Arena::CreateMessage<RepeatedField<float>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_BOOL:
        extension->repeated_bool_value =
            Arena::CreateMessage<RepeatedField<bool>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_ENUM:
        extension->repeated_enum_value =
            Arena::CreateMessage<RepeatedField<int>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_STRING:
        extension->repeated_string_value =
            Arena::CreateMessage<RepeatedPtrField<std::string>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_MESSAGE:
        extension->repeated_message_value =
            Arena::CreateMessage<RepeatedPtrField<MessageLite>>(arena_);
        break;
    }
  }

  // We assume that all the RepeatedField<>* pointers have the same
  // size and alignment within the anonymous union in Extension.
  return extension->repeated_int32_t_value;
}